

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::BeginGlobal
          (BinaryReaderLogging *this,Index index,Type type,bool mutable_)

{
  Stream *this_00;
  Enum EVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  Type local_58;
  string local_50;
  
  local_58 = type;
  WriteIndent(this);
  this_00 = this->stream_;
  Type::GetName_abi_cxx11_(&local_50,&local_58);
  pcVar2 = "false";
  if ((int)CONCAT71(in_register_00000009,mutable_) != 0) {
    pcVar2 = "true";
  }
  Stream::Writef(this_00,"BeginGlobal(index: %u, type: %s, mutable: %s)\n",index,
                 local_50._M_dataplus._M_p,pcVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x26])(this->reader_,index,local_58,mutable_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::BeginGlobal(Index index, Type type, bool mutable_) {
  LOGF("BeginGlobal(index: %" PRIindex ", type: %s, mutable: %s)\n", index,
       type.GetName().c_str(), mutable_ ? "true" : "false");
  return reader_->BeginGlobal(index, type, mutable_);
}